

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

bool __thiscall Potassco::AspifTextInput::matchDirective(AspifTextInput *this)

{
  bool bVar1;
  int iVar2;
  ProgramReader *in_RDI;
  int t;
  int s;
  uint x;
  int h;
  int p;
  int v_1;
  Atom_t a_1;
  Value_t v;
  Atom_t a;
  Weight_t prio;
  Heuristic_t in_stack_fffffffffffffeec;
  undefined1 cnd;
  AspifTextInput *in_stack_fffffffffffffef0;
  _func_int **pp_Var3;
  undefined4 in_stack_fffffffffffffef8;
  Weight_t in_stack_fffffffffffffefc;
  int iVar4;
  AspifTextInput *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Atom_t AVar5;
  undefined4 in_stack_ffffffffffffff10;
  Head_t in_stack_ffffffffffffff14;
  int local_c4;
  LitSpan local_b8;
  int local_a8;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff60 [16];
  Heuristic_t local_8c;
  Heuristic_t local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  int local_78;
  Atom_t local_74;
  undefined1 in_stack_ffffffffffffff90 [16];
  Value_t local_5c;
  Value_t local_58;
  Value_t local_54;
  Value_t local_50;
  Atom_t local_4c;
  LitSpan local_48;
  Span<char> local_38;
  AtomSpan local_28;
  Head_t local_18;
  int local_14;
  
  bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
  uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
  if (bVar1) {
    RuleBuilder::startMinimize((RuleBuilder *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    matchAgg(in_stack_ffffffffffffff00);
    bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
    if (bVar1) {
      local_c4 = matchInt(in_stack_fffffffffffffef0);
    }
    else {
      local_c4 = 0;
    }
    local_14 = local_c4;
    match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
    RuleBuilder::setBound((RuleBuilder *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec.val_);
    RuleBuilder::end(in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_);
  }
  else {
    bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
    uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
    if (bVar1) {
      Head_t::Head_t(&local_18,Disjunctive);
      RuleBuilder::start((RuleBuilder *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         in_stack_ffffffffffffff14);
      bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
      if (bVar1) {
        matchAtoms((AspifTextInput *)
                   CONCAT44(in_stack_ffffffffffffff14.val_,in_stack_ffffffffffffff10),
                   (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
      }
      match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
      pp_Var3 = in_RDI[1]._vptr_ProgramReader;
      local_28 = Data::atoms((Data *)0x10eb42);
      (**(code **)(*pp_Var3 + 0x38))(pp_Var3,&local_28);
    }
    else {
      bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
      uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
      if (bVar1) {
        matchTerm(in_stack_ffffffffffffff00);
        matchCondition(in_stack_fffffffffffffef0);
        match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
        pp_Var3 = in_RDI[1]._vptr_ProgramReader;
        local_38 = toSpan<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffef0);
        local_48 = Data::lits((Data *)0x10ebec);
        (**(code **)(*pp_Var3 + 0x40))(pp_Var3,&local_38,&local_48);
      }
      else {
        bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
        uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
        if (bVar1) {
          local_4c = matchId((AspifTextInput *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          Value_t::Value_t(&local_50,False);
          match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
          bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6)
          ;
          if (bVar1) {
            bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                          (bool)uVar6);
            if (bVar1) {
              Value_t::Value_t(&local_54,True);
              local_50.val_ = local_54.val_;
            }
            else {
              bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                            (bool)uVar6);
              if (bVar1) {
                Value_t::Value_t(&local_58,Free);
                local_50.val_ = local_58.val_;
              }
              else {
                bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                              (bool)uVar6);
                if (bVar1) {
                  Value_t::Value_t(&local_5c,Release);
                  local_50.val_ = local_5c.val_;
                }
                else {
                  match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6)
                  ;
                }
              }
            }
            match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
          }
          (**(code **)(*in_RDI[1]._vptr_ProgramReader + 0x48))
                    (in_RDI[1]._vptr_ProgramReader,local_4c,local_50.val_);
        }
        else {
          bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6)
          ;
          uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
          if (bVar1) {
            RuleBuilder::startBody((RuleBuilder *)in_stack_fffffffffffffef0);
            bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                          (bool)uVar6);
            if (bVar1) {
              matchLits(in_stack_fffffffffffffef0);
              match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
            }
            match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
            pp_Var3 = in_RDI[1]._vptr_ProgramReader;
            Data::lits((Data *)0x10ee2e);
            (**(code **)(*pp_Var3 + 0x50))(pp_Var3,&stack0xffffffffffffff90);
          }
          else {
            bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                          (bool)uVar6);
            uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
            if (bVar1) {
              local_74 = matchId((AspifTextInput *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
              matchCondition(in_stack_fffffffffffffef0);
              match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                    SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
              match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                    SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
              local_78 = matchInt(in_stack_fffffffffffffef0);
              local_7c = 0;
              bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                            SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
              if (bVar1) {
                local_7c = matchInt(in_stack_fffffffffffffef0);
                ProgramReader::require
                          (&in_stack_fffffffffffffef0->super_ProgramReader,
                           SUB41(in_stack_fffffffffffffeec.val_ >> 0x18,0),(char *)0x10ef21);
              }
              match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                    SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
              local_80 = 0xffffffff;
              for (local_84 = 0; uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18),
                  local_84 < 6; local_84 = local_84 + 1) {
                Heuristic_t::Heuristic_t(&local_88,local_84);
                toString(in_stack_fffffffffffffeec);
                bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                              SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
                uVar6 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
                if (bVar1) {
                  local_80 = local_84;
                  break;
                }
              }
              ProgramReader::require
                        (&in_stack_fffffffffffffef0->super_ProgramReader,
                         SUB41(in_stack_fffffffffffffeec.val_ >> 0x18,0),(char *)0x10efd3);
              skipws((AspifTextInput *)0x10efdd);
              match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
              pp_Var3 = in_RDI[1]._vptr_ProgramReader;
              AVar5 = local_74;
              Heuristic_t::Heuristic_t(&local_8c,local_80);
              iVar4 = local_78;
              iVar2 = local_7c;
              Data::lits((Data *)0x10f044);
              (**(code **)(*pp_Var3 + 0x58))
                        (pp_Var3,AVar5,local_8c.val_,iVar4,iVar2,&stack0xffffffffffffff60);
            }
            else {
              bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                            (bool)uVar6);
              cnd = (undefined1)(in_stack_fffffffffffffeec.val_ >> 0x18);
              if (bVar1) {
                match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6);
                iVar2 = matchInt(in_stack_fffffffffffffef0);
                match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                      SUB41((uint)iVar2 >> 0x18,0));
                local_a8 = matchInt(in_stack_fffffffffffffef0);
                match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                      SUB41((uint)iVar2 >> 0x18,0));
                matchCondition(in_stack_fffffffffffffef0);
                match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                      SUB41((uint)iVar2 >> 0x18,0));
                pp_Var3 = in_RDI[1]._vptr_ProgramReader;
                iVar4 = local_a8;
                local_b8 = Data::lits((Data *)0x10f13b);
                (**(code **)(*pp_Var3 + 0x60))(pp_Var3,iVar2,iVar4,&local_b8);
              }
              else {
                bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                              (bool)uVar6);
                if (bVar1) {
                  ProgramReader::incremental(in_RDI);
                  ProgramReader::require
                            (&in_stack_fffffffffffffef0->super_ProgramReader,(bool)cnd,
                             (char *)0x10f1a2);
                  match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6)
                  ;
                  return false;
                }
                bVar1 = match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,
                              (bool)uVar6);
                if (bVar1) {
                  match(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_,(bool)uVar6)
                  ;
                }
                else {
                  ProgramReader::require
                            (&in_stack_fffffffffffffef0->super_ProgramReader,(bool)cnd,
                             (char *)0x10f206);
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AspifTextInput::matchDirective() {
	if (match("#minimize", false)) {
		data_->rule.startMinimize(0);
		matchAgg();
		Weight_t prio = match("@", false) ? matchInt() : 0;
		match(".");
		data_->rule.setBound(prio);
		data_->rule.end(out_);
	}
	else if (match("#project", false)) {
		data_->rule.start();
		if (match("{", false)) {
			matchAtoms(",");
			match("}");
		}
		match(".");
		out_->project(data_->atoms());
	}
	else if (match("#output", false)) {
		matchTerm();
		matchCondition();
		match(".");
		out_->output(toSpan(data_->symbol), data_->lits());
	}
	else if (match("#external", false)) {
		Atom_t  a = matchId();
		Value_t v = Value_t::False;
		match(".");
		if (match("[", false)) {
			if      (match("true", false))    { v = Value_t::True; }
			else if (match("free", false))    { v = Value_t::Free; }
			else if (match("release", false)) { v = Value_t::Release; }
			else                              { match("false"); }
			match("]");
		}
		out_->external(a, v);
	}
	else if (match("#assume", false)) {
		data_->rule.startBody();
		if (match("{", false)) {
			matchLits();
			match("}");
		}
		match(".");
		out_->assume(data_->lits());
	}
	else if (match("#heuristic", false)) {
		Atom_t a = matchId();
		matchCondition();
		match(".");
		match("[");
		int v = matchInt();
		int p = 0;
		if (match("@", false)) { p = matchInt(); require(p >= 0, "positive priority expected"); }
		match(",");
		int h = -1;
		for (unsigned x = 0; x <= static_cast<unsigned>(Heuristic_t::eMax); ++x) {
			if (match(toString(static_cast<Heuristic_t>(x)), false)) {
				h = static_cast<int>(x);
				break;
			}
		}
		require(h >= 0, "unrecognized heuristic modification");
		skipws();
		match("]");
		out_->heuristic(a, static_cast<Heuristic_t>(h), v, static_cast<unsigned>(p), data_->lits());
	}
	else if (match("#edge", false)) {
		int s, t;
		match("("), s = matchInt(), match(","), t = matchInt(), match(")");
		matchCondition();
		match(".");
		out_->acycEdge(s, t, data_->lits());
	}
	else if (match("#step", false)) {
		require(incremental(), "#step requires incremental program");
		match(".");
		return false;
	}
	else if (match("#incremental", false)) {
		match(".");
	}
	else {
		require(false, "unrecognized directive");
	}
	return true;
}